

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O1

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  ResScalar *res;
  double dVar1;
  RhsScalar *pRVar2;
  ulong cols_00;
  LhsScalar *pLVar3;
  ulong uVar4;
  undefined8 *puVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  size_t __size;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  double dStack_1b8;
  long local_1b0;
  ulong local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  ulong local_180;
  ulong local_178;
  long local_170;
  long local_168;
  RhsScalar *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  ulong local_140;
  double *local_138;
  double *local_130;
  long local_128;
  double *local_120;
  double *local_118;
  ulong local_110;
  int local_104;
  double *pdStack_100;
  int l1;
  long local_f8;
  ulong local_f0;
  long local_e8;
  double *local_e0;
  long local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  long local_b8;
  RhsScalar *local_b0;
  RhsScalar *local_a8;
  ulong local_a0;
  LhsScalar *local_98;
  RhsScalar *local_90;
  RhsScalar *local_88;
  uint local_80;
  uint local_7c;
  int l2;
  int l3;
  long local_70;
  double *local_68;
  double *local_60;
  LhsScalar *local_58;
  RhsScalar local_50;
  long cols;
  ulong uStack_40;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_32;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_31 [7];
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  
  pdVar9 = &dStack_1b8;
  local_e8 = triStride;
  local_148 = _tri;
  local_50 = (RhsScalar)otherSize;
  local_a0 = size;
  lVar14 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    lVar14 = size;
  }
  uStack_40 = blocking->m_kc;
  uVar17 = lVar14 * blocking->m_kc;
  if (uVar17 >> 0x3d != 0) {
LAB_0010f705:
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = operator_delete;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_58 = blocking->m_blockA;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar17 < 0x4001) {
      pdVar9 = (double *)((long)&dStack_1b8 - (uVar17 * 8 + 0xf & 0xfffffffffffffff0));
      local_98 = pdVar9;
      local_58 = pdVar9;
    }
    else {
      local_58 = (LhsScalar *)malloc(uVar17 * 8);
      local_98 = local_58;
      if (local_58 == (LhsScalar *)0x0) goto LAB_0010f705;
    }
  }
  else {
    local_98 = (LhsScalar *)0x0;
    pdVar9 = &dStack_1b8;
  }
  uVar8 = uStack_40 * (long)local_50;
  local_d0 = uVar8;
  if (0x1fffffffffffffff < uVar8) {
    pdVar9[-1] = 5.49336275575861e-318;
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = operator_delete;
    pdVar9[-1] = 5.49354061939111e-318;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a8 = blocking->m_blockB;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar8 < 0x4001) {
      pdVar9 = (double *)((long)pdVar9 - (uVar8 * 8 + 0xf & 0xfffffffffffffff0));
      local_90 = pdVar9;
      local_a8 = pdVar9;
    }
    else {
      pdVar9[-1] = 5.48394092389242e-318;
      local_a8 = (RhsScalar *)malloc(uVar8 * 8);
      local_90 = local_a8;
      if (local_a8 == (RhsScalar *)0x0) {
        pdVar9[-1] = 5.49384199943508e-318;
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = operator_delete;
        pdVar9[-1] = 5.49401986306758e-318;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_90 = (RhsScalar *)0x0;
  }
  if ((uStack_40 & 0x1c00000000000000) != 0) {
    pdVar9[-1] = 5.4935900259557e-318;
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = operator_delete;
    pdVar9[-1] = 5.4937678895882e-318;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_b0 = blocking->m_blockW;
  if (blocking->m_blockW == (RhsScalar *)0x0) {
    __size = uStack_40 * 0x40;
    if (__size < 0x20001) {
      pdVar9 = pdVar9 + uStack_40 * -8;
      local_88 = pdVar9;
      local_b0 = pdVar9;
    }
    else {
      pdVar9[-1] = 5.4845486246368e-318;
      local_b0 = (RhsScalar *)malloc(__size);
      local_88 = local_b0;
      if (local_b0 == (RhsScalar *)0x0) {
        pdVar9[-1] = 5.49406926963216e-318;
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = operator_delete;
        pdVar9[-1] = (double)&LAB_0010f7f0;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_88 = (RhsScalar *)0x0;
  }
  local_110 = uStack_40 << 6;
  if (manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize == 0) {
    local_104 = -1;
    pdVar9[-1] = 5.4849290551841e-318;
    queryCacheSizes(&local_104,(int *)&local_80,(int *)&local_7c);
    iVar6 = 0x2000;
    if (0 < local_104) {
      iVar6 = local_104;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l1CacheSize = (long)iVar6;
    local_80 = 0xffffffff;
    local_7c = 0xffffffff;
    pdVar9[-1] = 5.48519585063285e-318;
    queryCacheSizes(&local_104,(int *)&local_80,(int *)&local_7c);
    uVar7 = local_7c;
    if ((int)local_7c < (int)local_80) {
      uVar7 = local_80;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = 0x100000;
    if (0 < (int)uVar7) {
      manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = (ulong)uVar7;
    }
  }
  local_d8 = lVar14;
  local_c8 = uVar17;
  if ((long)local_50 < 1) {
    uVar17 = 0;
  }
  else {
    uVar8 = manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize /
            (ulong)(otherStride << 5);
    uVar17 = uVar8 + 3;
    if (-1 < (long)uVar8) {
      uVar17 = uVar8;
    }
    uVar17 = uVar17 & 0xfffffffffffffffc;
  }
  if ((long)uVar17 < 5) {
    uVar17 = 4;
  }
  if (0 < (long)local_a0) {
    local_118 = _other + 1;
    local_170 = uStack_40 * 8;
    local_190 = otherStride * uVar17 * 8;
    local_138 = local_148 + 1;
    local_1b0 = local_e8 * 8 + 8;
    local_168 = uStack_40 * local_1b0;
    local_198 = local_e8 * 0x20 + 0x20;
    local_130 = _other + uStack_40;
    local_188 = lVar14 * 8;
    local_128 = local_a0 - uStack_40;
    local_120 = local_148 + uStack_40;
    local_140 = uVar17;
    uVar17 = local_a0;
    lVar14 = 0;
    do {
      local_178 = uVar17;
      if ((long)uStack_40 < (long)uVar17) {
        uVar17 = uStack_40;
      }
      local_180 = uVar17;
      uVar17 = local_a0 - lVar14;
      if ((long)uStack_40 < (long)(local_a0 - lVar14)) {
        uVar17 = uStack_40;
      }
      _l2 = uVar17;
      if (0 < (long)local_50) {
        local_e0 = local_118;
        lVar11 = 0;
        local_70 = lVar14;
        do {
          local_60 = (double *)lVar11;
          local_c0 = (long)local_50 - lVar11;
          uVar8 = local_c0;
          if ((long)local_140 < (long)local_c0) {
            uVar8 = local_140;
          }
          local_f0 = uVar8;
          if (0 < (long)uVar17) {
            local_160 = local_a8 + lVar11 * uVar17;
            local_158 = _other + lVar11 * otherStride;
            pdStack_100 = local_138;
            local_150 = local_e0;
            lVar19 = 0;
            uVar10 = local_180;
            do {
              cols_00 = local_f0;
              pRVar2 = local_160;
              local_1a8 = uVar10;
              uVar4 = 4;
              if ((long)uVar10 < 4) {
                uVar4 = uVar10;
              }
              if ((long)uVar4 < 2) {
                uVar4 = 1;
              }
              local_b8 = lVar19;
              local_f8 = uVar17 - lVar19;
              lVar14 = 4;
              if (local_f8 < 4) {
                lVar14 = local_f8;
              }
              local_68 = (double *)lVar14;
              if (0 < local_f8) {
                uVar17 = 0;
                pdVar12 = pdStack_100;
                pdVar13 = local_150;
                do {
                  if (0 < (long)local_c0) {
                    pdVar15 = pdVar13;
                    pdVar16 = local_60;
                    do {
                      if (0 < (long)(~uVar17 + lVar14)) {
                        dVar1 = _other[(long)pdVar16 * otherStride + local_70 + lVar19 + uVar17];
                        lVar18 = 0;
                        do {
                          pdVar15[lVar18] = pdVar12[lVar18] * -dVar1 + pdVar15[lVar18];
                          lVar18 = lVar18 + 1;
                        } while (lVar18 < (long)(~uVar17 + lVar14));
                      }
                      pdVar16 = (double *)((long)pdVar16 + 1);
                      pdVar15 = pdVar15 + otherStride;
                    } while ((long)pdVar16 < (long)(uVar8 + lVar11));
                  }
                  uVar17 = uVar17 + 1;
                  pdVar13 = pdVar13 + 1;
                  pdVar12 = (double *)((long)pdVar12 + local_1b0);
                } while (uVar17 != uVar4);
              }
              local_1a0 = lVar19 + local_70;
              pdVar12 = local_158 + lVar19 + local_70;
              pdVar9[-1] = (double)lVar19;
              pdVar9[-2] = (double)_l2;
              pdVar9[-3] = 5.48923730761584e-318;
              gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
                        ((gemm_pack_rhs<double,_long,_4,_0,_false,_true> *)((long)&cols + 7),pRVar2,
                         pdVar12,otherStride,lVar14,cols_00,(long)pdVar9[-2],(long)pdVar9[-1]);
              lVar19 = local_e8;
              lVar18 = local_f8 - lVar14;
              if (lVar18 != 0 && lVar14 <= local_f8) {
                local_f8 = lVar14 + local_1a0;
                pdVar12 = local_148 + local_1a0 * local_e8 + lVar14 + local_1a0;
                pdVar9[-2] = 0.0;
                pdVar9[-1] = 0.0;
                pLVar3 = local_58;
                pdVar9[-3] = 5.48971161063584e-318;
                gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                          (local_31,pLVar3,pdVar12,lVar19,lVar14,lVar18,(long)pdVar9[-2],
                           (long)pdVar9[-1]);
                pLVar3 = local_58;
                pdVar12 = local_68;
                pRVar2 = local_160;
                res = local_158 + local_f8;
                pdVar9[-2] = (double)local_b0;
                pdVar9[-3] = (double)local_b8;
                pdVar9[-4] = 0.0;
                pdVar9[-5] = (double)_l2;
                pdVar9[-6] = (double)pdVar12;
                pdVar9[-7] = (double)local_f0;
                pdVar9[-8] = (double)pdVar12;
                pdVar9[-9] = 5.49016121037356e-318;
                gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                          (&local_32,res,otherStride,pLVar3,pRVar2,lVar18,(long)pdVar9[-8],
                           (long)pdVar9[-7],-1.0,(long)pdVar9[-6],(long)pdVar9[-5],(long)pdVar9[-4],
                           (long)pdVar9[-3],(double *)pdVar9[-2]);
              }
              lVar19 = local_b8 + 4;
              uVar10 = local_1a8 - 4;
              local_150 = local_150 + 4;
              pdStack_100 = (double *)((long)pdStack_100 + local_198);
              uVar17 = _l2;
              lVar14 = local_70;
            } while (lVar19 < (long)_l2);
          }
          lVar11 = (long)local_60 + local_140;
          local_e0 = (double *)((long)local_e0 + local_190);
        } while (lVar11 < (long)local_50);
      }
      lVar14 = lVar14 + uStack_40;
      local_68 = local_120;
      local_c0 = local_128;
      local_60 = local_130;
      local_70 = lVar14;
      if (lVar14 < (long)local_a0) {
        do {
          uVar17 = local_c0;
          local_c0 = local_c0 - local_d8;
          if (local_d8 <= (long)uVar17) {
            uVar17 = local_d8;
          }
          if (0 < (long)uVar17) {
            pdVar9[-2] = 0.0;
            pdVar9[-1] = 0.0;
            pLVar3 = local_58;
            pdVar12 = local_68;
            uVar8 = _l2;
            lVar11 = local_e8;
            pdVar9[-3] = 5.49146554367858e-318;
            gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                      (local_31,pLVar3,pdVar12,lVar11,uVar8,uVar17,(long)pdVar9[-2],(long)pdVar9[-1]
                      );
            uVar8 = _l2;
            pdVar9[-2] = (double)local_b0;
            pdVar9[-4] = 0.0;
            pdVar9[-3] = 0.0;
            pdVar9[-5] = -NAN;
            pdVar9[-6] = -NAN;
            pdVar9[-7] = local_50;
            pdVar9[-8] = (double)uVar8;
            pLVar3 = local_58;
            pdVar12 = local_60;
            pRVar2 = local_a8;
            pdVar9[-9] = 5.49196949063734e-318;
            gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                      (&local_32,pdVar12,otherStride,pLVar3,pRVar2,uVar17,(long)pdVar9[-8],
                       (long)pdVar9[-7],-1.0,(long)pdVar9[-6],(long)pdVar9[-5],(long)pdVar9[-4],
                       (long)pdVar9[-3],(double *)pdVar9[-2]);
          }
          lVar14 = lVar14 + local_d8;
          local_60 = (double *)((long)local_60 + local_188);
          local_68 = (double *)((long)local_68 + local_188);
        } while (lVar14 < (long)local_a0);
      }
      uVar17 = local_178 - uStack_40;
      local_118 = (double *)((long)local_118 + local_170);
      local_138 = (double *)((long)local_138 + local_168);
      local_130 = (double *)((long)local_130 + local_170);
      local_128 = local_128 - uStack_40;
      local_120 = (double *)((long)local_120 + local_168);
      lVar14 = local_70;
    } while (local_70 < (long)local_a0);
  }
  pRVar2 = local_88;
  if (0x20000 < local_110) {
    pdVar9[-1] = 5.49275011435777e-318;
    free(pRVar2);
  }
  pRVar2 = local_90;
  uVar17 = local_c8;
  if (0x4000 < local_d0) {
    pdVar9[-1] = 5.49290821536444e-318;
    free(pRVar2);
  }
  pLVar3 = local_98;
  if (0x4000 < uVar17) {
    pdVar9[-1] = 5.49301196915006e-318;
    free(pLVar3);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> tri(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> other(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2;
    manage_caching_sizes(GetAction, &l1, &l2);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * otherStride) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index s  = IsLower ? k2+k1 : i+1;
            Index rs = actualPanelWidth - k - 1; // remaining size

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Index s = IsLower ? i+1 : i-rs;
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, &other(startBlock,j2), otherStride, actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, &tri(startTarget,startBlock), triStride, actualPanelWidth, lengthTarget);

            gebp_kernel(&other(startTarget,j2), otherStride, blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset, blockW);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, &tri(i2, IsLower ? k2 : k2-kc), triStride, actual_kc, actual_mc);

            gebp_kernel(_other+i2, otherStride, blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0, blockW);
          }
        }
      }
    }
  }